

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

lzham_compress_state_ptr lzham::lzham_lib_compress_init(lzham_compress_params *pParams)

{
  lzham_uint32 lVar1;
  lzham_uint32 lVar2;
  lzham_int32 lVar3;
  lzham_uint32 lVar4;
  lzham_uint32 lVar5;
  undefined4 uVar6;
  lzham_uint32 lVar7;
  lzham_uint32 lVar8;
  lzham_compress_level lVar9;
  lzham_uint32 lVar10;
  uint uVar11;
  lzham_compress_status_t lVar12;
  int iVar13;
  lzham *this;
  lzham_compress_state *this_00;
  ulong *in_RCX;
  lzham_compress_params *plVar14;
  lzham_compress_state *plVar15;
  init_params local_60;
  
  if (pParams == (lzham_compress_params *)0x0) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_struct_size != 0x38) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_dict_size_log2 - 0x1e < 0xfffffff1) {
    return (lzham_compress_state_ptr)0x0;
  }
  local_60.m_pTask_pool = (task_pool *)0x0;
  local_60.m_max_helper_threads = 0;
  local_60.m_compression_level = cCompressionLevelDefault;
  local_60.m_dict_size_log2 = 0x16;
  local_60.m_block_size = 0x80000;
  local_60.m_lzham_compress_flags = 0;
  local_60.m_pSeed_bytes = (void *)0x0;
  local_60.m_num_seed_bytes = 0;
  local_60.m_table_max_update_interval = 0;
  local_60.m_table_update_interval_slow_rate = 0;
  local_60.m_extreme_parsing_max_best_arrivals = 4;
  local_60.m_fast_bytes_override = 0;
  plVar14 = pParams;
  lVar12 = create_internal_init_params(&local_60,pParams);
  if (lVar12 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    return (lzham_compress_state_ptr)0x0;
  }
  this = (lzham *)lzham::lzham_create_malloc_context((lzham *)0x0,(uint)plVar14);
  plVar15 = (lzham_compress_state *)0xc0f6c0;
  this_00 = (lzham_compress_state *)lzham::lzham_malloc(this,(void *)0xc0f6c0,0,in_RCX);
  if (this_00 == (lzham_compress_state *)0x0) goto LAB_00105ade;
  lzham_compress_state::lzham_compress_state(this_00,this);
  lVar1 = pParams->m_fast_bytes;
  (this_00->m_params).m_extreme_parsing_max_best_arrivals =
       pParams->m_extreme_parsing_max_best_arrivals;
  (this_00->m_params).m_fast_bytes = lVar1;
  lVar7 = pParams->m_struct_size;
  lVar8 = pParams->m_dict_size_log2;
  lVar9 = pParams->m_level;
  lVar10 = pParams->m_table_update_rate;
  lVar3 = pParams->m_max_helper_threads;
  lVar4 = pParams->m_compress_flags;
  lVar5 = pParams->m_num_seed_bytes;
  uVar6 = *(undefined4 *)&pParams->field_0x1c;
  lVar1 = pParams->m_table_max_update_interval;
  lVar2 = pParams->m_table_update_interval_slow_rate;
  (this_00->m_params).m_pSeed_bytes = pParams->m_pSeed_bytes;
  (this_00->m_params).m_table_max_update_interval = lVar1;
  (this_00->m_params).m_table_update_interval_slow_rate = lVar2;
  (this_00->m_params).m_max_helper_threads = lVar3;
  (this_00->m_params).m_compress_flags = lVar4;
  (this_00->m_params).m_num_seed_bytes = lVar5;
  *(undefined4 *)&(this_00->m_params).field_0x1c = uVar6;
  (this_00->m_params).m_struct_size = lVar7;
  (this_00->m_params).m_dict_size_log2 = lVar8;
  (this_00->m_params).m_level = lVar9;
  (this_00->m_params).m_table_update_rate = lVar10;
  this_00->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
  this_00->m_pIn_buf = (uint8 *)0x0;
  this_00->m_pIn_buf_size = (size_t *)0x0;
  this_00->m_pOut_buf = (uint8 *)0x0;
  this_00->m_pOut_buf_size = (size_t *)0x0;
  *(undefined8 *)((long)&this_00->m_pOut_buf_size + 1) = 0;
  *(undefined8 *)((long)&this_00->m_comp_data_ofs + 1) = 0;
  uVar11 = local_60.m_max_helper_threads;
  plVar15 = (lzham_compress_state *)local_60.m_pTask_pool;
  if (local_60.m_max_helper_threads == 0) {
LAB_00105abb:
    local_60.m_pTask_pool = &plVar15->m_tp;
    iVar13 = lzcompressor::init(&this_00->m_compressor,(EVP_PKEY_CTX *)&local_60);
    if ((char)iVar13 != '\0') {
      return this_00;
    }
  }
  else {
    iVar13 = task_pool::init((task_pool *)this_00,(EVP_PKEY_CTX *)(local_60._8_8_ & 0xffffffff));
    if ((char)iVar13 != '\0') {
      plVar15 = this_00;
      if ((this_00->m_tp).m_num_threads < uVar11) {
        local_60._8_8_ = local_60._8_8_ & 0xffffffff00000000;
        plVar15 = (lzham_compress_state *)local_60.m_pTask_pool;
      }
      goto LAB_00105abb;
    }
  }
  lzham_delete<lzham::lzham_compress_state>(this,this_00);
  plVar15 = this_00;
LAB_00105ade:
  lzham::lzham_destroy_malloc_context(this,plVar15);
  return (lzham_compress_state_ptr)0x0;
}

Assistant:

lzham_compress_state_ptr LZHAM_CDECL lzham_lib_compress_init(const lzham_compress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_compress_params)))
      {
         LZHAM_LOG_ERROR(6004);
         return NULL;
      }

      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(6005);
         return NULL;
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6006);
         return NULL;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      lzham_compress_state *pState = lzham_new<lzham_compress_state>(malloc_context, malloc_context);
      if (!pState)
      {
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6007);
         return NULL;
      }

      pState->m_params = *pParams;

      pState->m_pIn_buf = NULL;
      pState->m_pIn_buf_size = NULL;
      pState->m_pOut_buf = NULL;
      pState->m_pOut_buf_size = NULL;
      pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      pState->m_comp_data_ofs = 0;
      pState->m_finished_compression = false;

      if (internal_params.m_max_helper_threads)
      {
         if (!pState->m_tp.init(internal_params.m_max_helper_threads))
         {
            lzham_delete(malloc_context, pState);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6008);
            return NULL;
         }
         if (pState->m_tp.get_num_threads() >= internal_params.m_max_helper_threads)
         {
            internal_params.m_pTask_pool = &pState->m_tp;
         }
         else
         {
            internal_params.m_max_helper_threads = 0;
         }
      }

      if (!pState->m_compressor.init(internal_params))
      {
         lzham_delete(malloc_context, pState);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6009);
         return NULL;
      }

      return pState;
   }